

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall
tf::Executor::
_schedule<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
          (Executor *this,Worker *worker,
          __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
          first,__normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                last)

{
  anon_class_16_2_3fe397bd *on_full;
  size_type sVar1;
  Node *in_RSI;
  BoundedTaskQueue<tf::Node_*,_8UL> *in_RDI;
  size_t i_1;
  Node *node;
  size_t i;
  size_t num_nodes;
  scoped_lock<std::mutex> lock;
  unsigned_long b;
  mutex_type *in_stack_ffffffffffffff48;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  *in_stack_ffffffffffffff50;
  NonblockingNotifierV2 *this_00;
  pointer in_stack_ffffffffffffff58;
  NonblockingNotifierV2 *in_stack_ffffffffffffff60;
  anon_class_16_2_3fe397bd *local_90;
  anon_class_16_2_3fe397bd *local_70;
  BoundedTaskQueue<tf::Node_*,_8UL> *this_01;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  local_48;
  reference local_40;
  reference local_38;
  ulong local_18;
  pointer local_10;
  NonblockingNotifierV2 *local_8;
  
  this_01 = in_RDI;
  on_full = (anon_class_16_2_3fe397bd *)
            __gnu_cxx::operator-
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                        *)in_stack_ffffffffffffff48);
  if (on_full != (anon_class_16_2_3fe397bd *)0x0) {
    if ((BoundedTaskQueue<tf::Node_*,_8UL> *)(in_RSI->_name).field_2._M_allocated_capacity == in_RDI
       ) {
      for (local_70 = (anon_class_16_2_3fe397bd *)0x0; local_70 < on_full;
          local_70 = (anon_class_16_2_3fe397bd *)((long)&local_70->this + 1)) {
        local_38 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                   ::operator[](&local_48,(difference_type)local_70);
        std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::get
                  ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)in_stack_ffffffffffffff50
                  );
        BoundedTaskQueue<tf::Node*,8ul>::
        push<tf::Node*&,tf::Executor::_schedule<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>(tf::Worker&,__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>)::_lambda()_1_>
                  (this_01,(Node **)in_RSI,on_full);
        NonblockingNotifierV2::notify_one((NonblockingNotifierV2 *)0x1131a8);
      }
    }
    else {
      for (local_90 = (anon_class_16_2_3fe397bd *)0x0; local_90 < on_full;
          local_90 = (anon_class_16_2_3fe397bd *)((long)&local_90->this + 1)) {
        this_00 = (NonblockingNotifierV2 *)&in_RDI->field_0xd8;
        local_40 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                   ::operator[](&local_48,(difference_type)local_90);
        in_stack_ffffffffffffff58 =
             std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::get
                       ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)this_00);
        in_stack_ffffffffffffff60 = this_00;
        local_10 = in_stack_ffffffffffffff58;
        local_8 = this_00;
        sVar1 = std::
                vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                ::size((vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                        *)this_00);
        local_18 = (ulong)in_stack_ffffffffffffff58 % sVar1;
        std::
        vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
        ::operator[]((vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                      *)in_stack_ffffffffffffff60,local_18);
        std::scoped_lock<std::mutex>::scoped_lock
                  ((scoped_lock<std::mutex> *)this_00,in_stack_ffffffffffffff48);
        std::
        vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
        ::operator[]((vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                      *)in_stack_ffffffffffffff60,local_18);
        UnboundedTaskQueue<tf::Node_*>::push((UnboundedTaskQueue<tf::Node_*> *)this_01,in_RSI);
        std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x1132d5);
      }
      NonblockingNotifierV2::notify_n(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
    }
  }
  return;
}

Assistant:

void Executor::_schedule(Worker& worker, I first, I last) {

  size_t num_nodes = last - first;
  
  if(num_nodes == 0) {
    return;
  }
  
  // NOTE: We cannot use first/last in the for-loop (e.g., for(; first != last; ++first)).
  // This is because when a node v is inserted into the queue, v can run and finish 
  // immediately. If v is the last node in the graph, it will tear down the parent task vector
  // which cause the last ++first to fail. This problem is specific to MSVC which has a stricter
  // iterator implementation in std::vector than GCC/Clang.
  if(worker._executor == this) {
    for(size_t i=0; i<num_nodes; i++) {
      auto node = detail::get_node_ptr(first[i]);
      worker._wsq.push(node, [&](){ _buffers.push(node); });
      _notifier.notify_one();
    }
    return;
  }
  
  for(size_t i=0; i<num_nodes; i++) {
    _buffers.push(detail::get_node_ptr(first[i]));
  }
  _notifier.notify_n(num_nodes);
}